

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O1

QCommandLineOption __thiscall QCommandLineParser::addHelpOption(QCommandLineParser *this)

{
  QCommandLineParser *in_RSI;
  long in_FS_OFFSET;
  QCommandLineOption optHelpAll;
  QString local_e8;
  QString local_c8;
  QString local_a8;
  QString local_88;
  QString local_70;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->d = (QCommandLineParserPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  local_70.d.d = (Data *)0x0;
  local_70.d.ptr = L"h";
  local_70.d.size = 1;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_58,0,&local_70);
  QList<QString>::end((QList<QString> *)&local_58);
  local_88.d.d = (Data *)0x0;
  local_88.d.ptr = L"help";
  local_88.d.size = 4;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_58,local_58.size,&local_88);
  QList<QString>::end((QList<QString> *)&local_58);
  QCoreApplication::translate
            (&local_a8,"QCommandLineParser","Displays help on commandline options.",(char *)0x0,-1);
  local_c8.d.size = 0;
  local_c8.d.d = (Data *)0x0;
  local_c8.d.ptr = (char16_t *)0x0;
  local_e8.d.size = 0;
  local_e8.d.d = (Data *)0x0;
  local_e8.d.ptr = (char16_t *)0x0;
  QCommandLineOption::QCommandLineOption
            ((QCommandLineOption *)this,(QStringList *)&local_58,&local_a8,&local_c8,&local_e8);
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  addOption(in_RSI,(QCommandLineOption *)this);
  local_c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x1c511e;
  local_58.size = 8;
  QCoreApplication::translate
            (&local_70,"QCommandLineParser","Displays help, including generic Qt options.",
             (char *)0x0,-1);
  local_88.d.size = 0;
  local_88.d.d = (Data *)0x0;
  local_88.d.ptr = (char16_t *)0x0;
  local_a8.d.size = 0;
  local_a8.d.d = (Data *)0x0;
  local_a8.d.ptr = (char16_t *)0x0;
  QCommandLineOption::QCommandLineOption
            ((QCommandLineOption *)&local_c8,(QString *)&local_58,&local_70,&local_88,&local_a8);
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
    }
  }
  addOption(in_RSI,(QCommandLineOption *)&local_c8);
  in_RSI->d->builtinHelpOption = true;
  QCommandLineOption::~QCommandLineOption((QCommandLineOption *)&local_c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSharedDataPointer<QCommandLineOptionPrivate>)
           (QSharedDataPointer<QCommandLineOptionPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QCommandLineOption QCommandLineParser::addHelpOption()
{
    QCommandLineOption opt(QStringList()
#ifdef Q_OS_WIN
                << QStringLiteral("?")
#endif
                << QStringLiteral("h")
                << QStringLiteral("help"), tr("Displays help on commandline options."));
    addOption(opt);
    QCommandLineOption optHelpAll(QStringLiteral("help-all"),
                                  tr("Displays help, including generic Qt options."));
    addOption(optHelpAll);
    d->builtinHelpOption = true;
    return opt;
}